

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::
CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test::TestBody
          (CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test *this)

{
  byte bVar1;
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EURGBP",(allocator<char> *)&local_50);
  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Currencies::IsValidCurrency(\"EURGBP\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0x34,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EURJPY",(allocator<char> *)&local_50);
    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
    gtest_ar_.success_ = (bool)(bVar1 ^ 1);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&local_40);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&gtest_ar_,
                 (AssertionResult *)"Currencies::IsValidCurrency(\"EURJPY\")","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x35,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"AUDNZD",(allocator<char> *)&local_50);
      bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
      gtest_ar_.success_ = (bool)(bVar1 ^ 1);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__cxx11::string::~string((string *)&local_40);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,(internal *)&gtest_ar_,
                   (AssertionResult *)"Currencies::IsValidCurrency(\"AUDNZD\")","true","false",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0x36,local_40._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"USDEUR",(allocator<char> *)&local_50);
        bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
        gtest_ar_.success_ = (bool)(bVar1 ^ 1);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::__cxx11::string::~string((string *)&local_40);
        if (bVar1 == 0) goto LAB_00177722;
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,(internal *)&gtest_ar_,
                   (AssertionResult *)"Currencies::IsValidCurrency(\"USDEUR\")","true","false",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0x37,local_40._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  std::__cxx11::string::~string((string *)&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_50);
LAB_00177722:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(CurrenciesTest, test_currency_pairs_do_not_validate_as_a_currency)
{
    ASSERT_FALSE(Currencies::IsValidCurrency("EURGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrency("EURJPY"));
    ASSERT_FALSE(Currencies::IsValidCurrency("AUDNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrency("USDEUR"));
}